

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O0

void __thiscall
cmConfigureLog::cmConfigureLog
          (cmConfigureLog *this,string *logDir,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *logVersions)

{
  bool bVar1;
  StreamWriter *__p;
  undefined1 local_60 [8];
  StreamWriterBuilder builder;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *logVersions_local;
  string *logDir_local;
  cmConfigureLog *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)logDir);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->LogVersions,logVersions)
  ;
  std::ofstream::ofstream(&this->Stream);
  this->Indent = 0;
  this->Opened = false;
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)
             &this->Encoder);
  bVar1 = ::cm::
          contains<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_0>
                    (&this->LogVersions,&cmConfigureLog::LatestLogVersion);
  if (!bVar1) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->LogVersions,
               &cmConfigureLog::LatestLogVersion);
  }
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_60);
  __p = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_60);
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::reset
            (&this->Encoder,__p);
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_60);
  return;
}

Assistant:

cmConfigureLog::cmConfigureLog(std::string logDir,
                               std::vector<unsigned long> logVersions)
  : LogDir(std::move(logDir))
  , LogVersions(std::move(logVersions))
{
  // Always emit events for the latest log version.
  static const unsigned long LatestLogVersion = 1;
  if (!cm::contains(this->LogVersions, LatestLogVersion)) {
    this->LogVersions.emplace_back(LatestLogVersion);
  }

  Json::StreamWriterBuilder builder;
  this->Encoder.reset(builder.newStreamWriter());
}